

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-naming.h
# Opt level: O1

void wabt::RenameAll(Module *module)

{
  _Rb_tree_header *__position;
  pointer ppFVar1;
  pointer ppGVar2;
  pointer ppTVar3;
  pointer ppTVar4;
  pointer ppEVar5;
  pointer ppTVar6;
  pointer ppMVar7;
  pointer ppDVar8;
  pointer ppEVar9;
  Index IVar10;
  pointer ppFVar11;
  pointer ppEVar12;
  long lVar13;
  pointer ppGVar14;
  pointer ppTVar15;
  pointer ppTVar16;
  pointer ppEVar17;
  pointer ppTVar18;
  pointer ppMVar19;
  pointer ppDVar20;
  _Alloc_node __an;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  filter;
  _Alloc_node local_158;
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_150;
  basic_string_view<char,_std::char_traits<char>_> local_120 [15];
  
  memcpy(local_120,&DAT_00182b78,0xf0);
  __position = &local_150._M_impl.super__Rb_tree_header;
  local_150._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lVar13 = 0;
  local_150._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_150._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_158._M_t = &local_150;
  local_150._M_impl.super__Rb_tree_header._M_header._M_left = &__position->_M_header;
  local_150._M_impl.super__Rb_tree_header._M_header._M_right = &__position->_M_header;
  do {
    std::
    _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::_Identity<std::basic_string_view<char,std::char_traits<char>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::
    _M_insert_unique_<std::basic_string_view<char,std::char_traits<char>>const&,std::_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::_Identity<std::basic_string_view<char,std::char_traits<char>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>::_Alloc_node>
              ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::_Identity<std::basic_string_view<char,std::char_traits<char>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)&local_150,(const_iterator)__position,
               (basic_string_view<char,_std::char_traits<char>_> *)
               ((long)&local_120[0]._M_len + lVar13),&local_158);
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0xf0);
  ppFVar11 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  ppFVar1 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppFVar11 != ppFVar1) {
    IVar10 = 0;
    do {
      RenameToIdentifier(&(*ppFVar11)->name,IVar10,&module->func_bindings,
                         (set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)&local_150);
      ppFVar11 = ppFVar11 + 1;
      IVar10 = IVar10 + 1;
    } while (ppFVar11 != ppFVar1);
  }
  ppGVar14 = (module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppGVar2 = (module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppGVar14 != ppGVar2) {
    IVar10 = 0;
    do {
      RenameToIdentifier(&(*ppGVar14)->name,IVar10,&module->global_bindings,
                         (set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)0x0);
      ppGVar14 = ppGVar14 + 1;
      IVar10 = IVar10 + 1;
    } while (ppGVar14 != ppGVar2);
  }
  ppTVar15 = (module->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppTVar3 = (module->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar15 != ppTVar3) {
    IVar10 = 0;
    do {
      RenameToIdentifier(&(*ppTVar15)->name,IVar10,&module->table_bindings,
                         (set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)0x0);
      ppTVar15 = ppTVar15 + 1;
      IVar10 = IVar10 + 1;
    } while (ppTVar15 != ppTVar3);
  }
  ppTVar16 = (module->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppTVar4 = (module->tags).super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppTVar16 != ppTVar4) {
    IVar10 = 0;
    do {
      RenameToIdentifier(&(*ppTVar16)->name,IVar10,&module->tag_bindings,
                         (set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)0x0);
      ppTVar16 = ppTVar16 + 1;
      IVar10 = IVar10 + 1;
    } while (ppTVar16 != ppTVar4);
  }
  ppEVar17 = (module->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppEVar5 = (module->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar17 != ppEVar5) {
    IVar10 = 0;
    do {
      RenameToIdentifier(&(*ppEVar17)->name,IVar10,&module->export_bindings,
                         (set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)0x0);
      ppEVar17 = ppEVar17 + 1;
      IVar10 = IVar10 + 1;
    } while (ppEVar17 != ppEVar5);
  }
  ppTVar18 = (module->types).
             super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppTVar6 = (module->types).
            super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppTVar18 != ppTVar6) {
    IVar10 = 0;
    do {
      RenameToIdentifier(&(*ppTVar18)->name,IVar10,&module->type_bindings,
                         (set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)0x0);
      ppTVar18 = ppTVar18 + 1;
      IVar10 = IVar10 + 1;
    } while (ppTVar18 != ppTVar6);
  }
  ppMVar19 = (module->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppMVar7 = (module->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppMVar19 != ppMVar7) {
    IVar10 = 0;
    do {
      RenameToIdentifier(&(*ppMVar19)->name,IVar10,&module->memory_bindings,
                         (set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)0x0);
      ppMVar19 = ppMVar19 + 1;
      IVar10 = IVar10 + 1;
    } while (ppMVar19 != ppMVar7);
  }
  ppDVar20 = (module->data_segments).
             super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppDVar8 = (module->data_segments).
            super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppDVar20 != ppDVar8) {
    IVar10 = 0;
    do {
      RenameToIdentifier(&(*ppDVar20)->name,IVar10,&module->data_segment_bindings,
                         (set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)0x0);
      ppDVar20 = ppDVar20 + 1;
      IVar10 = IVar10 + 1;
    } while (ppDVar20 != ppDVar8);
  }
  ppEVar12 = (module->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppEVar9 = (module->elem_segments).
            super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppEVar12 != ppEVar9) {
    IVar10 = 0;
    do {
      RenameToIdentifier(&(*ppEVar12)->name,IVar10,&module->elem_segment_bindings,
                         (set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)0x0);
      ppEVar12 = ppEVar12 + 1;
      IVar10 = IVar10 + 1;
    } while (ppEVar12 != ppEVar9);
  }
  RenameToContents(&module->data_segments,&module->data_segment_bindings);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::_M_erase(&local_150,(_Link_type)local_150._M_impl.super__Rb_tree_header._M_header._M_parent);
  return;
}

Assistant:

void RenameAll(Module& module) {
  // We also filter common C++ keywords/STL idents that make for huge
  // identifiers.
  // FIXME: this can obviously give bad results if the input is not C++..
  std::set<std::string_view> filter = {
      {"const"},    {"std"},   {"allocator"}, {"char"},  {"basic"},
      {"traits"},   {"wchar"}, {"t"},         {"void"},  {"int"},
      {"unsigned"}, {"2"},     {"cxxabiv1"},  {"short"}, {"4096ul"},
  };
  RenameToIdentifiers(module.funcs, module.func_bindings, &filter);
  // Also do this for some other kinds of names, but without the keyword
  // substitution.
  RenameToIdentifiers(module.globals, module.global_bindings, nullptr);
  RenameToIdentifiers(module.tables, module.table_bindings, nullptr);
  RenameToIdentifiers(module.tags, module.tag_bindings, nullptr);
  RenameToIdentifiers(module.exports, module.export_bindings, nullptr);
  RenameToIdentifiers(module.types, module.type_bindings, nullptr);
  RenameToIdentifiers(module.memories, module.memory_bindings, nullptr);
  RenameToIdentifiers(module.data_segments, module.data_segment_bindings,
                      nullptr);
  RenameToIdentifiers(module.elem_segments, module.elem_segment_bindings,
                      nullptr);
  // Special purpose naming for data segments.
  RenameToContents(module.data_segments, module.data_segment_bindings);
}